

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::DiffComplex<KTXcubemapIncomplete>::printText
          (DiffComplex<KTXcubemapIncomplete> *this,size_t index,PrintIndent *out,char *prefix)

{
  char *in_stack_00000080;
  PrintIndent *in_stack_00000088;
  KTXcubemapIncomplete *in_stack_00000090;
  
  std::optional<KTXcubemapIncomplete>::operator->((optional<KTXcubemapIncomplete> *)0x171ab2);
  CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::
  char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KTXcubemapIncomplete::printText(ktx::
  PrintIndent__char_const___const(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }